

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.h
# Opt level: O2

CScript * BuildScript<unsigned_long_const&>(CScript *__return_storage_ptr__,unsigned_long *inputs)

{
  long in_FS_OFFSET;
  int cnt;
  anon_class_16_2_441f04d1 local_30;
  int local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 0x10) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 0x18) = 0;
  local_30.cnt = &local_1c;
  local_1c = 0;
  (__return_storage_ptr__->super_CScriptBase)._union.indirect_contents.indirect = (char *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 8) = 0;
  local_30.ret = __return_storage_ptr__;
  BuildScript<const_unsigned_long_&>::anon_class_16_2_441f04d1::operator()(&local_30,inputs);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CScript BuildScript(Ts&&... inputs)
{
    CScript ret;
    int cnt{0};

    ([&ret, &cnt] (Ts&& input) {
        if constexpr (std::is_same_v<std::remove_cv_t<std::remove_reference_t<Ts>>, CScript>) {
            // If it is a CScript, extend ret with it. Move or copy the first element instead.
            if (cnt == 0) {
                ret = std::forward<Ts>(input);
            } else {
                ret.insert(ret.end(), input.begin(), input.end());
            }
        } else {
            // Otherwise invoke CScript::operator<<.
            ret << input;
        }
        cnt++;
    } (std::forward<Ts>(inputs)), ...);

    return ret;
}